

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

void __thiscall
dg::vr::ValueRelations::add
          (ValueRelations *this,V val,Handle h,VectorSet<const_llvm::Value_*> *vals)

{
  iterator __pos;
  iterator iVar1;
  V oldVal;
  V local_40;
  key_type local_38;
  V local_30;
  
  local_40 = val;
  __pos = std::
          _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::_Select1st<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
          ::lower_bound(&(this->valToBucket)._M_t,&local_40);
  if (((_Rb_tree_header *)__pos._M_node == &(this->valToBucket)._M_t._M_impl.super__Rb_tree_header)
     || (local_40 < *(V *)(__pos._M_node + 1))) {
    std::
    _Rb_tree<llvm::Value_const*,std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>,std::_Select1st<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>,std::less<llvm::Value_const*>,std::allocator<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>>
    ::_M_emplace_hint_unique<llvm::Value_const*&,dg::vr::Bucket_const&>
              ((_Rb_tree<llvm::Value_const*,std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>,std::_Select1st<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>,std::less<llvm::Value_const*>,std::allocator<std::pair<llvm::Value_const*const,std::reference_wrapper<dg::vr::Bucket_const>>>>
                *)&this->valToBucket,(const_iterator)__pos._M_node,&local_40,h);
  }
  else {
    local_38._M_data = (Bucket *)__pos._M_node[1]._M_parent;
    if ((local_38._M_data)->id == h->id) {
      return;
    }
    local_30 = *(V *)(__pos._M_node + 1);
    iVar1 = std::
            _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
            ::find(&(this->bucketToVals)._M_t,&local_38);
    VectorSet<llvm::Value_const*>::erase<llvm::Value_const*,bool>
              ((VectorSet<llvm::Value_const*> *)&iVar1._M_node[1]._M_parent,&local_30);
    __pos._M_node[1]._M_parent = (_Base_ptr)h;
  }
  VectorSet<llvm::Value_const*>::emplace<llvm::Value_const*&>
            ((VectorSet<llvm::Value_const*> *)vals,&local_40);
  this->changed = true;
  return;
}

Assistant:

void ValueRelations::add(V val, Handle h, VectorSet<V> &vals) {
    ValToBucket::iterator it = valToBucket.lower_bound(val);
    // val already bound to a handle
    if (it != valToBucket.end() && !(valToBucket.key_comp()(val, it->first))) {
        // it is already bound to passed handle
        if (it->second == h)
            return;
        V oldVal = it->first;
        Handle oldH = it->second;
        assert(bucketToVals.find(oldH) != bucketToVals.end());
        assert(bucketToVals.at(oldH).find(oldVal) !=
               bucketToVals.at(oldH).end());
        bucketToVals.find(oldH)->second.erase(oldVal);
        it->second = h;
    } else
        valToBucket.emplace_hint(it, val, h);

    assert(valToBucket.find(val)->second == h);
    vals.emplace(val);
    updateChanged(true);
}